

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,FixedArray<char,_1UL> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6,
          ArrayPtr<const_char> *params_7,CappedArray<char,_14UL> *params_8,
          ArrayPtr<const_char> *params_9)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *__n;
  size_t result_2;
  long lVar3;
  char *pcVar4;
  size_t result;
  size_t sVar5;
  String local_b8;
  char *local_98;
  size_t sStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  size_t sStack_60;
  char *local_58;
  undefined8 uStack_50;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_98 = (this->text).content.ptr;
  sStack_90 = params->size_;
  local_88 = 1;
  uStack_80 = *(undefined8 *)(params_2 + 8);
  local_78 = params_3->size_;
  sStack_70 = params_4->size_;
  local_68 = params_5->size_;
  sStack_60 = params_6->size_;
  local_58 = params_7->ptr;
  uStack_50 = *(undefined8 *)params_8->content;
  sVar5 = 0;
  lVar3 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_98 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x50);
  __return_storage_ptr__->size_ = sVar5;
  local_88 = 1;
  sVar5 = 0;
  lVar3 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_98 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x50);
  local_40 = params_1;
  local_38 = params_3;
  heapString(&local_b8,sVar5);
  pcVar4 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar5 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar4,1,sVar5,sVar5,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_b8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_b8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_b8.content.disposer;
  local_58 = (char *)0x0;
  uStack_50 = 0;
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = (char *)0x0;
  sStack_90 = 0;
  sVar5 = 0;
  lVar3 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_98 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x50);
  local_b8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar5,sVar5,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_b8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_b8.content.size_ = sVar5;
  if (pBVar2 != (Branch *)0x0) {
    sVar5 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar5,sVar5,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_b8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_b8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_b8.content.disposer;
  pcVar4 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (this->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar4,(void *)this->size_,(size_t)__n);
    pcVar4 = pcVar4 + (long)__n;
  }
  fill<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar4,0,params,(FixedArray<char,_1UL> *)local_40,
             (ArrayPtr<const_char> *)params_2,local_38,params_4,params_5,params_6,
             (CappedArray<char,_14UL> *)params_7,(ArrayPtr<const_char> *)params_8);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}